

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

void kj::Path::evalPart(Vector<kj::String> *parts,ArrayPtr<const_char> part)

{
  undefined8 this;
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  String *pSVar4;
  size_t in_RCX;
  ArrayPtr<const_char> value;
  String local_120;
  String local_108;
  Fault local_f0;
  Fault f_1;
  size_t local_e0;
  DebugExpression<unsigned_long> local_d8;
  undefined1 local_d0 [8];
  DebugComparison<unsigned_long,_unsigned_long> _kjCondition_1;
  undefined1 local_90 [8];
  String str;
  Fault local_68;
  Fault f;
  size_t local_58;
  DebugExpression<unsigned_long> local_50;
  undefined1 local_48 [8];
  DebugComparison<unsigned_long,_int> _kjCondition;
  Vector<kj::String> *parts_local;
  ArrayPtr<const_char> part_local;
  
  part_local.ptr = (char *)part.size_;
  parts_local = (Vector<kj::String> *)part.ptr;
  _kjCondition._32_8_ = parts;
  sVar2 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)&parts_local);
  if ((sVar2 != 0) &&
     ((sVar2 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)&parts_local), sVar2 != 1 ||
      (pcVar3 = ArrayPtr<const_char>::operator[]((ArrayPtr<const_char> *)&parts_local,0),
      *pcVar3 != '.')))) {
    sVar2 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)&parts_local);
    if ((sVar2 == 2) &&
       ((pcVar3 = ArrayPtr<const_char>::operator[]((ArrayPtr<const_char> *)&parts_local,0),
        *pcVar3 == '.' &&
        (pcVar3 = ArrayPtr<const_char>::operator[]((ArrayPtr<const_char> *)&parts_local,1),
        *pcVar3 == '.')))) {
      local_58 = Vector<kj::String>::size((Vector<kj::String> *)_kjCondition._32_8_);
      local_50 = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_58);
      f.exception._4_4_ = 0;
      kj::_::DebugExpression<unsigned_long>::operator>
                ((DebugComparison<unsigned_long,_int> *)local_48,&local_50,
                 (int *)((long)&f.exception + 4));
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_48);
      if (bVar1) {
        Vector<kj::String>::removeLast((Vector<kj::String> *)_kjCondition._32_8_);
      }
      else {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[50]>
                  (&local_68,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x13f,FAILED,"parts.size() > 0",
                   "_kjCondition,\"can\'t use \\\"..\\\" to break out of starting directory\"",
                   (DebugComparison<unsigned_long,_int> *)local_48,
                   (char (*) [50])"can\'t use \"..\" to break out of starting directory");
        kj::_::Debug::Fault::~Fault(&local_68);
      }
    }
    else {
      _kjCondition_1._32_8_ = parts_local;
      value.size_ = in_RCX;
      value.ptr = part_local.ptr;
      heapString((String *)local_90,(kj *)parts_local,value);
      pcVar3 = String::begin((String *)local_90);
      local_e0 = strlen(pcVar3);
      local_d8 = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_e0);
      f_1.exception = (Exception *)String::size((String *)local_90);
      kj::_::DebugExpression<unsigned_long>::operator==
                ((DebugComparison<unsigned_long,_unsigned_long> *)local_d0,&local_d8,
                 (unsigned_long *)&f_1);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_d0);
      if (!bVar1) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&,char_const(&)[32],kj::String&>
                  (&local_f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x146,FAILED,"strlen(str.begin()) == str.size()",
                   "_kjCondition,\"NUL character in path component\", str",
                   (DebugComparison<unsigned_long,_unsigned_long> *)local_d0,
                   (char (*) [32])"NUL character in path component",(String *)local_90);
        pSVar4 = mv<kj::String>((String *)local_90);
        String::String(&local_120,pSVar4);
        stripNul(&local_108,&local_120);
        String::operator=((String *)local_90,&local_108);
        String::~String(&local_108);
        String::~String(&local_120);
        kj::_::Debug::Fault::~Fault(&local_f0);
      }
      this = _kjCondition._32_8_;
      pSVar4 = mv<kj::String>((String *)local_90);
      Vector<kj::String>::add<kj::String>((Vector<kj::String> *)this,pSVar4);
      String::~String((String *)local_90);
    }
  }
  return;
}

Assistant:

void Path::evalPart(Vector<String>& parts, ArrayPtr<const char> part) {
  if (part.size() == 0) {
    // Ignore consecutive or trailing '/'s.
  } else if (part.size() == 1 && part[0] == '.') {
    // Refers to current directory; ignore.
  } else if (part.size() == 2 && part[0] == '.' && part [1] == '.') {
    KJ_REQUIRE(parts.size() > 0, "can't use \"..\" to break out of starting directory") {
      // When exceptions are disabled, ignore.
      return;
    }
    parts.removeLast();
  } else {
    auto str = heapString(part);
    KJ_REQUIRE(strlen(str.begin()) == str.size(), "NUL character in path component", str) {
      // When exceptions are disabled, strip out '\0' chars.
      str = stripNul(kj::mv(str));
      break;
    }
    parts.add(kj::mv(str));
  }
}